

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.h
# Opt level: O3

void __thiscall
draco::PointCloud::AddAttributeMetadata
          (PointCloud *this,int32_t att_id,
          unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          *metadata)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> this_00;
  GeometryMetadata *this_01;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_20;
  
  this_01 = (this->metadata_)._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if (this_01 == (GeometryMetadata *)0x0) {
    this_01 = (GeometryMetadata *)operator_new(0x78);
    p_Var1 = (_Rb_tree_header *)((long)&(this_01->super_Metadata).entries_ + 8);
    (((_Rb_tree_header *)((long)&(this_01->super_Metadata).entries_ + 8))->_M_header)._M_color =
         _S_red;
    *(_Base_ptr *)((long)&(this_01->super_Metadata).entries_ + 0x10) = (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&(this_01->super_Metadata).entries_ + 0x18) = p_Var1;
    *(_Rb_tree_header **)((long)&(this_01->super_Metadata).entries_ + 0x20) = p_Var1;
    *(size_t *)((long)&(this_01->super_Metadata).entries_ + 0x28) = 0;
    p_Var1 = (_Rb_tree_header *)((long)&(this_01->super_Metadata).sub_metadatas_ + 8);
    (((_Rb_tree_header *)((long)&(this_01->super_Metadata).sub_metadatas_ + 8))->_M_header)._M_color
         = _S_red;
    *(_Base_ptr *)((long)&(this_01->super_Metadata).sub_metadatas_ + 0x10) = (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&(this_01->super_Metadata).sub_metadatas_ + 0x18) = p_Var1;
    *(_Rb_tree_header **)((long)&(this_01->super_Metadata).sub_metadatas_ + 0x20) = p_Var1;
    *(size_t *)((long)&(this_01->super_Metadata).sub_metadatas_ + 0x28) = 0;
    (this_01->att_metadatas_).
    super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
    *(pointer *)
     ((long)&(this_01->att_metadatas_).
             super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this_01->att_metadatas_).
             super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
     + 0x10) = (pointer)0x0;
    (this->metadata_)._M_t.
    super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
    .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl = this_01;
  }
  local_20._M_head_impl =
       (metadata->_M_t).
       super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
       ._M_t.
       super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
       .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
  (local_20._M_head_impl)->att_unique_id_ =
       *(uint32_t *)
        ((long)(this->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[att_id]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t + 0x3c);
  (metadata->_M_t).
  super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>.
  _M_t.
  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl = (AttributeMetadata *)0x0;
  GeometryMetadata::AddAttributeMetadata
            (this_01,(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                      *)&local_20);
  this_00._M_head_impl = local_20._M_head_impl;
  if (local_20._M_head_impl != (AttributeMetadata *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
    ::~_Rb_tree(&((local_20._M_head_impl)->super_Metadata).sub_metadatas_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                 *)this_00._M_head_impl);
    operator_delete(this_00._M_head_impl,0x68);
  }
  return;
}

Assistant:

void AddAttributeMetadata(int32_t att_id,
                            std::unique_ptr<AttributeMetadata> metadata) {
    if (!metadata_) {
      metadata_ = std::unique_ptr<GeometryMetadata>(new GeometryMetadata());
    }
    const int32_t att_unique_id = attribute(att_id)->unique_id();
    metadata->set_att_unique_id(att_unique_id);
    metadata_->AddAttributeMetadata(std::move(metadata));
  }